

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_flm.cpp
# Opt level: O2

void __thiscall phoenix_flm_t::flm_entry_t::_read(flm_entry_t *this)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  string local_30;
  
  kaitai::kstream::read_bytes_abi_cxx11_(&local_30,(this->super_kstruct).m__io,0x10);
  std::__cxx11::string::operator=((string *)&this->m_guid,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  uVar1 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_data_type = uVar1;
  uVar1 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_entry_type = uVar1;
  uVar3 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_physical_address = uVar3;
  uVar2 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_size = uVar2;
  uVar2 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_offset = uVar2;
  return;
}

Assistant:

void phoenix_flm_t::flm_entry_t::_read() {
    m_guid = m__io->read_bytes(16);
    m_data_type = m__io->read_u2le();
    m_entry_type = m__io->read_u2le();
    m_physical_address = m__io->read_u8le();
    m_size = m__io->read_u4le();
    m_offset = m__io->read_u4le();
}